

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm_lib.c
# Opt level: O0

void libdef_endmodule(BuildCtx *ctx)

{
  int iVar1;
  long in_RDI;
  int n;
  uint8_t *p;
  char line [80];
  int local_64;
  byte *local_60;
  char local_58 [80];
  long local_8;
  
  if (modstate != 0) {
    local_8 = in_RDI;
    if (modstate == 1) {
      fprintf(*(FILE **)(in_RDI + 0x10),"  (lua_CFunction)0");
    }
    fprintf(*(FILE **)(local_8 + 0x10),"\n};\n");
    fprintf(*(FILE **)(local_8 + 0x10),"static const uint8_t %s%s[] = {\n","lj_lib_init_",modname);
    local_58[0] = '\0';
    local_64 = 0;
    for (local_60 = obuf; local_60 < optr; local_60 = local_60 + 1) {
      iVar1 = sprintf(local_58 + local_64,"%d,",(ulong)*local_60);
      local_64 = iVar1 + local_64;
      if (0x4a < local_64) {
        fprintf(*(FILE **)(local_8 + 0x10),"%s\n",local_58);
        local_64 = 0;
        local_58[0] = '\0';
      }
    }
    fprintf(*(FILE **)(local_8 + 0x10),"%s%d\n};\n#endif\n\n",local_58,0xff);
  }
  return;
}

Assistant:

static void libdef_endmodule(BuildCtx *ctx)
{
  if (modstate != 0) {
    char line[80];
    const uint8_t *p;
    int n;
    if (modstate == 1)
      fprintf(ctx->fp, "  (lua_CFunction)0");
    fprintf(ctx->fp, "\n};\n");
    fprintf(ctx->fp, "static const uint8_t %s%s[] = {\n",
	    LABEL_PREFIX_LIBINIT, modname);
    line[0] = '\0';
    for (n = 0, p = obuf; p < optr; p++) {
      n += sprintf(line+n, "%d,", *p);
      if (n >= 75) {
	fprintf(ctx->fp, "%s\n", line);
	n = 0;
	line[0] = '\0';
      }
    }
    fprintf(ctx->fp, "%s%d\n};\n#endif\n\n", line, LIBINIT_END);
  }
}